

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_logic.cc
# Opt level: O0

void __thiscall
CLogicSocket::SendNoBodyPkgToClient
          (CLogicSocket *this,LPSTRUC_MSG_HEADER pMsgHeader,unsigned_short iMsgCode)

{
  uint16_t uVar1;
  void *__dest;
  uint16_t *puVar2;
  uint16_t in_DX;
  void *in_RSI;
  CMemory *in_RDI;
  LPCOMM_PKG_HEADER pKgHeader;
  char *p_tmpbuf;
  char *p_sendbuf;
  CMemory *p_memory;
  char *in_stack_00000fc8;
  CSocekt *in_stack_00000fd0;
  undefined1 in_stack_ffffffffffffffbb;
  int in_stack_ffffffffffffffbc;
  
  CMemory::GetInstance();
  __dest = CMemory::AllocMemory(in_RDI,in_stack_ffffffffffffffbc,(bool)in_stack_ffffffffffffffbb);
  memcpy(__dest,in_RSI,*(size_t *)(in_RDI + 0x10));
  puVar2 = (uint16_t *)(*(long *)(in_RDI + 0x10) + (long)__dest);
  uVar1 = htons(in_DX);
  puVar2[1] = uVar1;
  uVar1 = htons((uint16_t)*(undefined8 *)(in_RDI + 8));
  *puVar2 = uVar1;
  puVar2[2] = 0;
  puVar2[3] = 0;
  CSocekt::msgSend(in_stack_00000fd0,in_stack_00000fc8);
  return;
}

Assistant:

void CLogicSocket::SendNoBodyPkgToClient(LPSTRUC_MSG_HEADER pMsgHeader, unsigned short iMsgCode)
{
    CMemory *p_memory = CMemory::GetInstance();

    char *p_sendbuf = (char *)p_memory->AllocMemory(m_iLenMsgHeader + m_iLenPkgHeader, false);
    char *p_tmpbuf = p_sendbuf;
    //加入消息头，内含连接的指针，连接的序列号
    memcpy(p_tmpbuf, pMsgHeader, m_iLenMsgHeader);
    p_tmpbuf += m_iLenMsgHeader;

    //包头,内含消息码，包体长度，crc校验值
    LPCOMM_PKG_HEADER pKgHeader = (LPCOMM_PKG_HEADER)p_tmpbuf;
    pKgHeader->msgCode = htons(iMsgCode);
    pKgHeader->pkgLen = htons(m_iLenPkgHeader);
    pKgHeader->crc32 = 0;
    msgSend(p_sendbuf);

}